

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

CuePoint * __thiscall mkvparser::Cues::GetNext(Cues *this,CuePoint *pCurr)

{
  CuePoint **ppCVar1;
  long lVar2;
  long lVar3;
  CuePoint *pCVar4;
  CuePoint *pCVar5;
  
  if (((((pCurr != (CuePoint *)0x0) && (-1 < pCurr->m_timecode)) &&
       (ppCVar1 = this->m_cue_points, ppCVar1 != (CuePoint **)0x0)) &&
      ((lVar2 = this->m_count, 0 < lVar2 && (lVar3 = pCurr->m_index, lVar3 < lVar2)))) &&
     ((ppCVar1[lVar3] == pCurr &&
      ((lVar3 + 1 < lVar2 && (pCVar4 = ppCVar1[lVar3 + 1], pCVar4 != (CuePoint *)0x0)))))) {
    pCVar5 = (CuePoint *)0x0;
    if (-1 < pCVar4->m_timecode) {
      pCVar5 = pCVar4;
    }
    return pCVar5;
  }
  return (CuePoint *)0x0;
}

Assistant:

const CuePoint* Cues::GetNext(const CuePoint* pCurr) const {
  if (pCurr == NULL || pCurr->GetTimeCode() < 0 || m_cue_points == NULL ||
      m_count < 1) {
    return NULL;
  }

  long index = pCurr->m_index;
  if (index >= m_count)
    return NULL;

  CuePoint* const* const pp = m_cue_points;
  if (pp == NULL || pp[index] != pCurr)
    return NULL;

  ++index;

  if (index >= m_count)
    return NULL;

  CuePoint* const pNext = pp[index];

  if (pNext == NULL || pNext->GetTimeCode() < 0)
    return NULL;

  return pNext;
}